

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_parser.h
# Opt level: O2

Status sentencepiece::SentencePieceTrainer::SetProtoField
                 (string_view name,string_view value,TrainerSpec *message)

{
  uint32 *puVar1;
  _Rb_tree_color _Var2;
  string_view value_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  basic_string_view<char,_std::char_traits<char>_> __x_19;
  basic_string_view<char,_std::char_traits<char>_> __x_20;
  basic_string_view<char,_std::char_traits<char>_> __x_21;
  basic_string_view<char,_std::char_traits<char>_> __x_22;
  basic_string_view<char,_std::char_traits<char>_> __x_23;
  basic_string_view<char,_std::char_traits<char>_> __x_24;
  basic_string_view<char,_std::char_traits<char>_> __x_25;
  basic_string_view<char,_std::char_traits<char>_> __x_26;
  basic_string_view<char,_std::char_traits<char>_> __x_27;
  basic_string_view<char,_std::char_traits<char>_> __x_28;
  basic_string_view<char,_std::char_traits<char>_> __x_29;
  basic_string_view<char,_std::char_traits<char>_> __x_30;
  basic_string_view<char,_std::char_traits<char>_> __x_31;
  basic_string_view<char,_std::char_traits<char>_> __x_32;
  basic_string_view<char,_std::char_traits<char>_> __x_33;
  basic_string_view<char,_std::char_traits<char>_> __x_34;
  basic_string_view<char,_std::char_traits<char>_> __x_35;
  basic_string_view<char,_std::char_traits<char>_> __x_36;
  basic_string_view<char,_std::char_traits<char>_> __x_37;
  basic_string_view<char,_std::char_traits<char>_> __x_38;
  basic_string_view<char,_std::char_traits<char>_> __x_39;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  StatusBuilder *pSVar6;
  char *pcVar7;
  char *pcVar8;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  this;
  string_util *psVar9;
  TrainerSpec *in_R9;
  string *val;
  long lVar10;
  string *psVar11;
  basic_string_view<char,_std::char_traits<char>_> __x_40;
  basic_string_view<char,_std::char_traits<char>_> __x_41;
  basic_string_view<char,_std::char_traits<char>_> __x_42;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_18;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_19;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_20;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_21;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_22;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_23;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_24;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_25;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_26;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_27;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_28;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_29;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_30;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_31;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_32;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_33;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_34;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_35;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_36;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_37;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_38;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_39;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_40;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_41;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_42;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view arg_07;
  string_view arg_08;
  string_view arg_09;
  string_view arg_10;
  string_view arg_11;
  string_view arg_12;
  string_view arg_13;
  string_view arg_14;
  string_view arg_15;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>
  __l;
  string_view arg_16;
  string_view arg_17;
  string_view arg_18;
  string_view arg_19;
  string_view arg_20;
  string_view arg_21;
  string_view arg_22;
  string_view arg_23;
  string_view arg_24;
  string_view arg_25;
  string_view arg_26;
  string_view arg_27;
  undefined8 uStack_1e8;
  int32 v;
  undefined4 uStack_1dc;
  string_view value_local;
  allocator_type local_1c1;
  undefined1 local_1c0 [8];
  string *local_1b8;
  string_view in_stack_fffffffffffffe58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  local_148 [6];
  string_view name_local;
  
  value_local._M_len = (size_t)value._M_str;
  pcVar7 = (char *)value._M_len;
  pcVar8 = name._M_str;
  this._M_t.
  super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  ._M_t.
  super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
  .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl =
       (__uniq_ptr_data<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>,_true,_true>
        )name._M_len;
  value_local._M_str = (char *)message;
  name_local._M_len = (size_t)pcVar8;
  name_local._M_str = pcVar7;
  if (in_R9 == (TrainerSpec *)0x0) {
    local_1c0._0_4_ = kInternal;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
    std::operator<<((ostream *)&local_1b8,"third_party/sentencepiece/src/spec_parser.h");
    std::operator<<((ostream *)&local_1b8,"(");
    std::ostream::operator<<((ostringstream *)&local_1b8,0xc5);
    std::operator<<((ostream *)&local_1b8,") [");
    std::operator<<((ostream *)&local_1b8,"message");
    std::operator<<((ostream *)&local_1b8,"] ");
    util::StatusBuilder::operator_cast_to_Status
              ((StatusBuilder *)
               this._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
    goto LAB_0023dbe3;
  }
  __x_40._M_str = pcVar7;
  __x_40._M_len = (size_t)pcVar8;
  __y._M_str = "input";
  __y._M_len = 5;
  bVar3 = std::operator==(__x_40,__y);
  if (bVar3) {
    util::StrSplitAsCSV_abi_cxx11_(in_stack_fffffffffffffe58);
    for (psVar11 = (string *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_); psVar11 != local_1b8;
        psVar11 = psVar11 + 1) {
      TrainerSpec::add_input(in_R9,psVar11);
    }
    goto LAB_0023eb11;
  }
  __x_41._M_str = pcVar7;
  __x_41._M_len = (size_t)pcVar8;
  __y_00._M_str = "input_format";
  __y_00._M_len = 0xc;
  bVar3 = std::operator==(__x_41,__y_00);
  if (bVar3) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_1c0,&value_local,(allocator<char> *)&v);
    TrainerSpec::set_input_format(in_R9,(string *)local_1c0);
  }
  else {
    __x_42._M_str = pcVar7;
    __x_42._M_len = (size_t)pcVar8;
    __y_01._M_str = "model_prefix";
    __y_01._M_len = 0xc;
    bVar3 = std::operator==(__x_42,__y_01);
    if (bVar3) {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_1c0,&value_local,(allocator<char> *)&v);
      TrainerSpec::set_model_prefix(in_R9,(string *)local_1c0);
    }
    else {
      if ((SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
           ::kModelType_Map_abi_cxx11_ == '\0') &&
         (iVar4 = __cxa_guard_acquire(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                                       ::kModelType_Map_abi_cxx11_), iVar4 != 0)) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
        ::pair<const_char_(&)[8],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
                    *)local_1c0,(char (*) [8])0x36eed3,&TrainerSpec::UNIGRAM);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
        ::pair<const_char_(&)[4],_true>(&local_198,(char (*) [4])0x36f2aa,&TrainerSpec::BPE);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
        ::pair<const_char_(&)[5],_true>(&local_170,(char (*) [5])"WORD",&TrainerSpec::WORD);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
        ::pair<const_char_(&)[5],_true>(local_148,(char (*) [5])"CHAR",&TrainerSpec::CHAR);
        __l._M_len = 4;
        __l._M_array = (iterator)local_1c0;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
        ::map(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
               ::kModelType_Map_abi_cxx11_,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&v,&local_1c1);
        lVar10 = 0x78;
        do {
          std::__cxx11::string::~string((string *)(local_1c0 + lVar10));
          lVar10 = lVar10 + -0x28;
        } while (lVar10 != -0x28);
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
                     ::~map,&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                             ::kModelType_Map_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                             ::kModelType_Map_abi_cxx11_);
      }
      __x_39._M_str = name_local._M_str;
      __x_39._M_len = name_local._M_len;
      __x_38._M_str = name_local._M_str;
      __x_38._M_len = name_local._M_len;
      __x_37._M_str = name_local._M_str;
      __x_37._M_len = name_local._M_len;
      __x_36._M_str = name_local._M_str;
      __x_36._M_len = name_local._M_len;
      __x_35._M_str = name_local._M_str;
      __x_35._M_len = name_local._M_len;
      __x_34._M_str = name_local._M_str;
      __x_34._M_len = name_local._M_len;
      __x_33._M_str = name_local._M_str;
      __x_33._M_len = name_local._M_len;
      __x_32._M_str = name_local._M_str;
      __x_32._M_len = name_local._M_len;
      __x_31._M_str = name_local._M_str;
      __x_31._M_len = name_local._M_len;
      __x_30._M_str = name_local._M_str;
      __x_30._M_len = name_local._M_len;
      __x_29._M_str = name_local._M_str;
      __x_29._M_len = name_local._M_len;
      __x_28._M_str = name_local._M_str;
      __x_28._M_len = name_local._M_len;
      __x_27._M_str = name_local._M_str;
      __x_27._M_len = name_local._M_len;
      __x_26._M_str = name_local._M_str;
      __x_26._M_len = name_local._M_len;
      __x_25._M_str = name_local._M_str;
      __x_25._M_len = name_local._M_len;
      __x_24._M_str = name_local._M_str;
      __x_24._M_len = name_local._M_len;
      __x_23._M_str = name_local._M_str;
      __x_23._M_len = name_local._M_len;
      __x_22._M_str = name_local._M_str;
      __x_22._M_len = name_local._M_len;
      __x_21._M_str = name_local._M_str;
      __x_21._M_len = name_local._M_len;
      __x_20._M_str = name_local._M_str;
      __x_20._M_len = name_local._M_len;
      __x_19._M_str = name_local._M_str;
      __x_19._M_len = name_local._M_len;
      __x_18._M_str = name_local._M_str;
      __x_18._M_len = name_local._M_len;
      __x_17._M_str = name_local._M_str;
      __x_17._M_len = name_local._M_len;
      __x_16._M_str = name_local._M_str;
      __x_16._M_len = name_local._M_len;
      __x_15._M_str = name_local._M_str;
      __x_15._M_len = name_local._M_len;
      __x_14._M_str = name_local._M_str;
      __x_14._M_len = name_local._M_len;
      __x_13._M_str = name_local._M_str;
      __x_13._M_len = name_local._M_len;
      __x_12._M_str = name_local._M_str;
      __x_12._M_len = name_local._M_len;
      __x_11._M_str = name_local._M_str;
      __x_11._M_len = name_local._M_len;
      __x_10._M_str = name_local._M_str;
      __x_10._M_len = name_local._M_len;
      __x_09._M_str = name_local._M_str;
      __x_09._M_len = name_local._M_len;
      __x_08._M_str = name_local._M_str;
      __x_08._M_len = name_local._M_len;
      __x_07._M_str = name_local._M_str;
      __x_07._M_len = name_local._M_len;
      __x_06._M_str = name_local._M_str;
      __x_06._M_len = name_local._M_len;
      __x_05._M_str = name_local._M_str;
      __x_05._M_len = name_local._M_len;
      __x_04._M_str = name_local._M_str;
      __x_04._M_len = name_local._M_len;
      __x_03._M_str = name_local._M_str;
      __x_03._M_len = name_local._M_len;
      __x_02._M_str = name_local._M_str;
      __x_02._M_len = name_local._M_len;
      __x_01._M_str = name_local._M_str;
      __x_01._M_len = name_local._M_len;
      __x_00._M_str = name_local._M_str;
      __x_00._M_len = name_local._M_len;
      __x._M_str = name_local._M_str;
      __x._M_len = name_local._M_len;
      __y_02._M_str = "model_type";
      __y_02._M_len = 10;
      bVar3 = std::operator==(__x,__y_02);
      if (bVar3) {
        value_00._M_str._0_4_ = v;
        value_00._M_len = uStack_1e8;
        value_00._M_str._4_4_ = uStack_1dc;
        absl::AsciiStrToUpper_abi_cxx11_(value_00);
        cVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
                ::find(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                        ::kModelType_Map_abi_cxx11_._M_t,(key_type *)local_1c0);
        std::__cxx11::string::~string((string *)local_1c0);
        if ((_Rb_tree_header *)cVar5._M_node ==
            &SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
             ::kModelType_Map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"unknown enumeration value of \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as ");
          std::operator<<((ostream *)&pSVar6->os_,"kModelType_Map");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
LAB_0023dbe3:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8);
          return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                  )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                    )this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
        }
        _Var2 = cVar5._M_node[2]._M_color;
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x1000000;
        in_R9->model_type_ = _Var2;
        goto LAB_0023eb1b;
      }
      __y_03._M_str = "vocab_size";
      __y_03._M_len = 10;
      pcVar7 = "vocab_size";
      bVar3 = std::operator==(__x_00,__y_03);
      if (bVar3) {
        arg._M_str = (char *)&v;
        arg._M_len = (size_t)value_local._M_str;
        bVar3 = string_util::lexical_cast<int>((string_util *)value_local._M_len,arg,(int *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x2000000;
        in_R9->vocab_size_ = v;
        goto LAB_0023eb1b;
      }
      __y_04._M_str = "accept_language";
      __y_04._M_len = 0xf;
      bVar3 = std::operator==(__x_01,__y_04);
      if (bVar3) {
        util::StrSplitAsCSV_abi_cxx11_(in_stack_fffffffffffffe58);
        for (psVar11 = (string *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_); psVar11 != local_1b8;
            psVar11 = psVar11 + 1) {
          TrainerSpec::add_accept_language(in_R9,psVar11);
        }
        goto LAB_0023eb11;
      }
      __y_05._M_str = "self_test_sample_size";
      __y_05._M_len = 0x15;
      pcVar7 = "self_test_sample_size";
      bVar3 = std::operator==(__x_02,__y_05);
      if (bVar3) {
        arg_00._M_str = (char *)&v;
        arg_00._M_len = (size_t)value_local._M_str;
        bVar3 = string_util::lexical_cast<int>
                          ((string_util *)value_local._M_len,arg_00,(int *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x400;
        in_R9->self_test_sample_size_ = v;
        goto LAB_0023eb1b;
      }
      __y_06._M_str = "character_coverage";
      __y_06._M_len = 0x12;
      pcVar7 = "character_coverage";
      bVar3 = std::operator==(__x_03,__y_06);
      if (bVar3) {
        arg_01._M_str = (char *)&v;
        arg_01._M_len = (size_t)value_local._M_str;
        bVar3 = string_util::lexical_cast<double>
                          ((string_util *)value_local._M_len,arg_01,(double *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x4000000;
        in_R9->character_coverage_ = (float)(double)CONCAT44(uStack_1dc,v);
        goto LAB_0023eb1b;
      }
      __y_07._M_str = "input_sentence_size";
      __y_07._M_len = 0x13;
      pcVar7 = "input_sentence_size";
      bVar3 = std::operator==(__x_04,__y_07);
      if (bVar3) {
        arg_02._M_str = (char *)&v;
        arg_02._M_len = (size_t)value_local._M_str;
        bVar3 = string_util::lexical_cast<unsigned_long>
                          ((string_util *)value_local._M_len,arg_02,(unsigned_long *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x1000;
        in_R9->input_sentence_size_ = CONCAT44(uStack_1dc,v);
        goto LAB_0023eb1b;
      }
      __y_08._M_str = "shuffle_input_sentence";
      __y_08._M_len = 0x16;
      pcVar7 = "shuffle_input_sentence";
      bVar3 = std::operator==(__x_05,__y_08);
      if (bVar3) {
        psVar9 = (string_util *)0x4;
        if (value_local._M_len != 0) {
          psVar9 = (string_util *)value_local._M_len;
        }
        pcVar8 = "true";
        if (value_local._M_len != 0) {
          pcVar8 = value_local._M_str;
        }
        arg_03._M_str = (char *)&v;
        arg_03._M_len = (size_t)pcVar8;
        bVar3 = string_util::lexical_cast<bool>(psVar9,arg_03,(bool *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 2;
        in_R9->shuffle_input_sentence_ = v._0_1_;
        goto LAB_0023eb1b;
      }
      __y_09._M_str = "seed_sentencepiece_size";
      __y_09._M_len = 0x17;
      pcVar7 = "seed_sentencepiece_size";
      bVar3 = std::operator==(__x_06,__y_09);
      if (bVar3) {
        arg_04._M_str = (char *)&v;
        arg_04._M_len = (size_t)value_local._M_str;
        bVar3 = string_util::lexical_cast<int>
                          ((string_util *)value_local._M_len,arg_04,(int *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x8000000;
        in_R9->seed_sentencepiece_size_ = v;
        goto LAB_0023eb1b;
      }
      __y_10._M_str = "shrinking_factor";
      __y_10._M_len = 0x10;
      pcVar7 = "shrinking_factor";
      bVar3 = std::operator==(__x_07,__y_10);
      if (bVar3) {
        arg_05._M_str = (char *)&v;
        arg_05._M_len = (size_t)value_local._M_str;
        bVar3 = string_util::lexical_cast<double>
                          ((string_util *)value_local._M_len,arg_05,(double *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x10000000;
        in_R9->shrinking_factor_ = (float)(double)CONCAT44(uStack_1dc,v);
        goto LAB_0023eb1b;
      }
      __y_11._M_str = "max_sentence_length";
      __y_11._M_len = 0x13;
      pcVar7 = "max_sentence_length";
      bVar3 = std::operator==(__x_08,__y_11);
      if (bVar3) {
        arg_06._M_str = (char *)&v;
        arg_06._M_len = (size_t)value_local._M_str;
        bVar3 = string_util::lexical_cast<int>
                          ((string_util *)value_local._M_len,arg_06,(int *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x80000000;
        in_R9->max_sentence_length_ = v;
        goto LAB_0023eb1b;
      }
      __y_12._M_str = "num_threads";
      __y_12._M_len = 0xb;
      pcVar7 = "num_threads";
      bVar3 = std::operator==(__x_09,__y_12);
      if (bVar3) {
        arg_07._M_str = (char *)&v;
        arg_07._M_len = (size_t)value_local._M_str;
        bVar3 = string_util::lexical_cast<int>
                          ((string_util *)value_local._M_len,arg_07,(int *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x20000000;
        in_R9->num_threads_ = v;
        goto LAB_0023eb1b;
      }
      __y_13._M_str = "num_sub_iterations";
      __y_13._M_len = 0x12;
      pcVar7 = "num_sub_iterations";
      bVar3 = std::operator==(__x_10,__y_13);
      if (bVar3) {
        arg_08._M_str = (char *)&v;
        arg_08._M_len = (size_t)value_local._M_str;
        bVar3 = string_util::lexical_cast<int>
                          ((string_util *)value_local._M_len,arg_08,(int *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x40000000;
        in_R9->num_sub_iterations_ = v;
        goto LAB_0023eb1b;
      }
      __y_14._M_str = "max_sentencepiece_length";
      __y_14._M_len = 0x18;
      pcVar7 = "max_sentencepiece_length";
      bVar3 = std::operator==(__x_11,__y_14);
      if (bVar3) {
        arg_09._M_str = (char *)&v;
        arg_09._M_len = (size_t)value_local._M_str;
        bVar3 = string_util::lexical_cast<int>
                          ((string_util *)value_local._M_len,arg_09,(int *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 1;
        in_R9->max_sentencepiece_length_ = v;
        goto LAB_0023eb1b;
      }
      __y_15._M_str = "split_by_unicode_script";
      __y_15._M_len = 0x17;
      pcVar7 = "split_by_unicode_script";
      bVar3 = std::operator==(__x_12,__y_15);
      if (bVar3) {
        psVar9 = (string_util *)0x4;
        if (value_local._M_len != 0) {
          psVar9 = (string_util *)value_local._M_len;
        }
        pcVar8 = "true";
        if (value_local._M_len != 0) {
          pcVar8 = value_local._M_str;
        }
        arg_10._M_str = (char *)&v;
        arg_10._M_len = (size_t)pcVar8;
        bVar3 = string_util::lexical_cast<bool>(psVar9,arg_10,(bool *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 4;
        in_R9->split_by_unicode_script_ = v._0_1_;
        goto LAB_0023eb1b;
      }
      __y_16._M_str = "split_by_number";
      __y_16._M_len = 0xf;
      pcVar7 = "split_by_number";
      bVar3 = std::operator==(__x_13,__y_16);
      if (bVar3) {
        psVar9 = (string_util *)0x4;
        if (value_local._M_len != 0) {
          psVar9 = (string_util *)value_local._M_len;
        }
        pcVar8 = "true";
        if (value_local._M_len != 0) {
          pcVar8 = value_local._M_str;
        }
        arg_11._M_str = (char *)&v;
        arg_11._M_len = (size_t)pcVar8;
        bVar3 = string_util::lexical_cast<bool>(psVar9,arg_11,(bool *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 8;
        in_R9->split_by_number_ = v._0_1_;
        goto LAB_0023eb1b;
      }
      __y_17._M_str = "split_by_whitespace";
      __y_17._M_len = 0x13;
      pcVar7 = "split_by_whitespace";
      bVar3 = std::operator==(__x_14,__y_17);
      if (bVar3) {
        psVar9 = (string_util *)0x4;
        if (value_local._M_len != 0) {
          psVar9 = (string_util *)value_local._M_len;
        }
        pcVar8 = "true";
        if (value_local._M_len != 0) {
          pcVar8 = value_local._M_str;
        }
        arg_12._M_str = (char *)&v;
        arg_12._M_len = (size_t)pcVar8;
        bVar3 = string_util::lexical_cast<bool>(psVar9,arg_12,(bool *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar1 = *puVar1 | 0x10;
        in_R9->split_by_whitespace_ = v._0_1_;
        goto LAB_0023eb1b;
      }
      __y_18._M_str = "split_digits";
      __y_18._M_len = 0xc;
      pcVar7 = "split_digits";
      bVar3 = std::operator==(__x_15,__y_18);
      if (bVar3) {
        psVar9 = (string_util *)0x4;
        if (value_local._M_len != 0) {
          psVar9 = (string_util *)value_local._M_len;
        }
        pcVar8 = "true";
        if (value_local._M_len != 0) {
          pcVar8 = value_local._M_str;
        }
        arg_13._M_str = (char *)&v;
        arg_13._M_len = (size_t)pcVar8;
        bVar3 = string_util::lexical_cast<bool>(psVar9,arg_13,(bool *)pcVar7);
        if (!bVar3) {
          local_1c0._0_4_ = kInvalidArgument;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
          std::operator<<((ostream *)&local_1b8,"cannot parse \"");
          pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
          std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0023dbe3;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x20000;
        in_R9->split_digits_ = v._0_1_;
        goto LAB_0023eb1b;
      }
      __y_19._M_str = "pretokenization_delimiter";
      __y_19._M_len = 0x19;
      bVar3 = std::operator==(__x_16,__y_19);
      if (!bVar3) {
        __y_20._M_str = "treat_whitespace_as_suffix";
        __y_20._M_len = 0x1a;
        pcVar7 = "treat_whitespace_as_suffix";
        bVar3 = std::operator==(__x_17,__y_20);
        if (bVar3) {
          psVar9 = (string_util *)0x4;
          if (value_local._M_len != 0) {
            psVar9 = (string_util *)value_local._M_len;
          }
          pcVar8 = "true";
          if (value_local._M_len != 0) {
            pcVar8 = value_local._M_str;
          }
          arg_14._M_str = (char *)&v;
          arg_14._M_len = (size_t)pcVar8;
          bVar3 = string_util::lexical_cast<bool>(psVar9,arg_14,(bool *)pcVar7);
          if (!bVar3) {
            local_1c0._0_4_ = kInvalidArgument;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
            std::operator<<((ostream *)&local_1b8,"cannot parse \"");
            pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
            std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
            util::StatusBuilder::operator_cast_to_Status
                      ((StatusBuilder *)
                       this._M_t.
                       super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                       _M_head_impl);
            goto LAB_0023dbe3;
          }
          (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x8000;
          in_R9->treat_whitespace_as_suffix_ = v._0_1_;
          goto LAB_0023eb1b;
        }
        __y_21._M_str = "allow_whitespace_only_pieces";
        __y_21._M_len = 0x1c;
        pcVar7 = "allow_whitespace_only_pieces";
        bVar3 = std::operator==(__x_18,__y_21);
        if (bVar3) {
          psVar9 = (string_util *)0x4;
          if (value_local._M_len != 0) {
            psVar9 = (string_util *)value_local._M_len;
          }
          pcVar8 = "true";
          if (value_local._M_len != 0) {
            pcVar8 = value_local._M_str;
          }
          arg_15._M_str = (char *)&v;
          arg_15._M_len = (size_t)pcVar8;
          bVar3 = string_util::lexical_cast<bool>(psVar9,arg_15,(bool *)pcVar7);
          if (!bVar3) {
            local_1c0._0_4_ = kInvalidArgument;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
            std::operator<<((ostream *)&local_1b8,"cannot parse \"");
            pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
            std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
            util::StatusBuilder::operator_cast_to_Status
                      ((StatusBuilder *)
                       this._M_t.
                       super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                       _M_head_impl);
            goto LAB_0023dbe3;
          }
          (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x10000;
          in_R9->allow_whitespace_only_pieces_ = v._0_1_;
          goto LAB_0023eb1b;
        }
        __y_22._M_str = "control_symbols";
        __y_22._M_len = 0xf;
        bVar3 = std::operator==(__x_19,__y_22);
        if (bVar3) {
          util::StrSplitAsCSV_abi_cxx11_(in_stack_fffffffffffffe58);
          for (psVar11 = (string *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_); psVar11 != local_1b8;
              psVar11 = psVar11 + 1) {
            TrainerSpec::add_control_symbols(in_R9,psVar11);
          }
        }
        else {
          __y_23._M_str = "user_defined_symbols";
          __y_23._M_len = 0x14;
          bVar3 = std::operator==(__x_20,__y_23);
          if (!bVar3) {
            __y_24._M_str = "required_chars";
            __y_24._M_len = 0xe;
            bVar3 = std::operator==(__x_21,__y_24);
            if (bVar3) {
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)local_1c0,&value_local,(allocator<char> *)&v);
              TrainerSpec::set_required_chars(in_R9,(string *)local_1c0);
            }
            else {
              __y_25._M_str = "byte_fallback";
              __y_25._M_len = 0xd;
              pcVar7 = "byte_fallback";
              bVar3 = std::operator==(__x_22,__y_25);
              if (bVar3) {
                psVar9 = (string_util *)0x4;
                if (value_local._M_len != 0) {
                  psVar9 = (string_util *)value_local._M_len;
                }
                pcVar8 = "true";
                if (value_local._M_len != 0) {
                  pcVar8 = value_local._M_str;
                }
                arg_16._M_str = (char *)&v;
                arg_16._M_len = (size_t)pcVar8;
                bVar3 = string_util::lexical_cast<bool>(psVar9,arg_16,(bool *)pcVar7);
                if (!bVar3) {
                  local_1c0._0_4_ = kInvalidArgument;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
                  std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                  pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
                  std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
                  util::StatusBuilder::operator_cast_to_Status
                            ((StatusBuilder *)
                             this._M_t.
                             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                             _M_head_impl);
                  goto LAB_0023dbe3;
                }
                (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x40000;
                in_R9->byte_fallback_ = v._0_1_;
                goto LAB_0023eb1b;
              }
              __y_26._M_str = "hard_vocab_limit";
              __y_26._M_len = 0x10;
              pcVar7 = "hard_vocab_limit";
              bVar3 = std::operator==(__x_23,__y_26);
              if (bVar3) {
                psVar9 = (string_util *)0x4;
                if (value_local._M_len != 0) {
                  psVar9 = (string_util *)value_local._M_len;
                }
                pcVar8 = "true";
                if (value_local._M_len != 0) {
                  pcVar8 = value_local._M_str;
                }
                arg_17._M_str = (char *)&v;
                arg_17._M_len = (size_t)pcVar8;
                bVar3 = string_util::lexical_cast<bool>(psVar9,arg_17,(bool *)pcVar7);
                if (!bVar3) {
                  local_1c0._0_4_ = kInvalidArgument;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
                  std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                  pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
                  std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
                  util::StatusBuilder::operator_cast_to_Status
                            ((StatusBuilder *)
                             this._M_t.
                             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                             _M_head_impl);
                  goto LAB_0023dbe3;
                }
                puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
                *puVar1 = *puVar1 | 0x40;
                in_R9->hard_vocab_limit_ = v._0_1_;
                goto LAB_0023eb1b;
              }
              __y_27._M_str = "vocabulary_output_piece_score";
              __y_27._M_len = 0x1d;
              pcVar7 = "vocabulary_output_piece_score";
              bVar3 = std::operator==(__x_24,__y_27);
              if (bVar3) {
                psVar9 = (string_util *)0x4;
                if (value_local._M_len != 0) {
                  psVar9 = (string_util *)value_local._M_len;
                }
                pcVar8 = "true";
                if (value_local._M_len != 0) {
                  pcVar8 = value_local._M_str;
                }
                arg_18._M_str = (char *)&v;
                arg_18._M_len = (size_t)pcVar8;
                bVar3 = string_util::lexical_cast<bool>(psVar9,arg_18,(bool *)pcVar7);
                if (!bVar3) {
                  local_1c0._0_4_ = kInvalidArgument;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
                  std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                  pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
                  std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
                  util::StatusBuilder::operator_cast_to_Status
                            ((StatusBuilder *)
                             this._M_t.
                             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                             _M_head_impl);
                  goto LAB_0023dbe3;
                }
                puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
                *puVar1 = *puVar1 | 0x20;
                in_R9->vocabulary_output_piece_score_ = v._0_1_;
                goto LAB_0023eb1b;
              }
              __y_28._M_str = "train_extremely_large_corpus";
              __y_28._M_len = 0x1c;
              pcVar7 = "train_extremely_large_corpus";
              bVar3 = std::operator==(__x_25,__y_28);
              if (bVar3) {
                psVar9 = (string_util *)0x4;
                if (value_local._M_len != 0) {
                  psVar9 = (string_util *)value_local._M_len;
                }
                pcVar8 = "true";
                if (value_local._M_len != 0) {
                  pcVar8 = value_local._M_str;
                }
                arg_19._M_str = (char *)&v;
                arg_19._M_len = (size_t)pcVar8;
                bVar3 = string_util::lexical_cast<bool>(psVar9,arg_19,(bool *)pcVar7);
                if (!bVar3) {
                  local_1c0._0_4_ = kInvalidArgument;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
                  std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                  pSVar6 = util::StatusBuilder::operator<<((StatusBuilder *)local_1c0,&value_local);
                  std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
                  util::StatusBuilder::operator_cast_to_Status
                            ((StatusBuilder *)
                             this._M_t.
                             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                             _M_head_impl);
                  goto LAB_0023dbe3;
                }
                (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x100000;
                in_R9->train_extremely_large_corpus_ = v._0_1_;
                goto LAB_0023eb1b;
              }
              __y_29._M_str = "seed_sentencepieces_file";
              __y_29._M_len = 0x18;
              bVar3 = std::operator==(__x_26,__y_29);
              if (bVar3) {
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)local_1c0,&value_local,(allocator<char> *)&v);
                TrainerSpec::set_seed_sentencepieces_file(in_R9,(string *)local_1c0);
              }
              else {
                __y_30._M_str = "use_all_vocab";
                __y_30._M_len = 0xd;
                pcVar7 = "use_all_vocab";
                bVar3 = std::operator==(__x_27,__y_30);
                if (bVar3) {
                  pcVar8 = "true";
                  if (value_local._M_len != 0) {
                    pcVar8 = value_local._M_str;
                  }
                  psVar9 = (string_util *)0x4;
                  if (value_local._M_len != 0) {
                    psVar9 = (string_util *)value_local._M_len;
                  }
                  arg_20._M_str = (char *)&v;
                  arg_20._M_len = (size_t)pcVar8;
                  bVar3 = string_util::lexical_cast<bool>(psVar9,arg_20,(bool *)pcVar7);
                  if (!bVar3) {
                    local_1c0._0_4_ = kInvalidArgument;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
                    std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                    pSVar6 = util::StatusBuilder::operator<<
                                       ((StatusBuilder *)local_1c0,&value_local);
                    std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
                    util::StatusBuilder::operator_cast_to_Status
                              ((StatusBuilder *)
                               this._M_t.
                               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                               _M_head_impl);
                    goto LAB_0023dbe3;
                  }
                  (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x80000;
                  in_R9->use_all_vocab_ = v._0_1_;
                  goto LAB_0023eb1b;
                }
                __y_31._M_str = "unk_id";
                __y_31._M_len = 6;
                pcVar7 = "unk_id";
                bVar3 = std::operator==(__x_28,__y_31);
                if (bVar3) {
                  arg_21._M_str = (char *)&v;
                  arg_21._M_len = (size_t)value_local._M_str;
                  bVar3 = string_util::lexical_cast<int>
                                    ((string_util *)value_local._M_len,arg_21,(int *)pcVar7);
                  if (!bVar3) {
                    local_1c0._0_4_ = kInvalidArgument;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
                    std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                    pSVar6 = util::StatusBuilder::operator<<
                                       ((StatusBuilder *)local_1c0,&value_local);
                    std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
                    util::StatusBuilder::operator_cast_to_Status
                              ((StatusBuilder *)
                               this._M_t.
                               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                               _M_head_impl);
                    goto LAB_0023dbe3;
                  }
                  (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x200000;
                  in_R9->unk_id_ = v;
                  goto LAB_0023eb1b;
                }
                __y_32._M_str = "bos_id";
                __y_32._M_len = 6;
                pcVar7 = "bos_id";
                bVar3 = std::operator==(__x_29,__y_32);
                if (bVar3) {
                  arg_22._M_str = (char *)&v;
                  arg_22._M_len = (size_t)value_local._M_str;
                  bVar3 = string_util::lexical_cast<int>
                                    ((string_util *)value_local._M_len,arg_22,(int *)pcVar7);
                  if (!bVar3) {
                    local_1c0._0_4_ = kInvalidArgument;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
                    std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                    pSVar6 = util::StatusBuilder::operator<<
                                       ((StatusBuilder *)local_1c0,&value_local);
                    std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
                    util::StatusBuilder::operator_cast_to_Status
                              ((StatusBuilder *)
                               this._M_t.
                               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                               _M_head_impl);
                    goto LAB_0023dbe3;
                  }
                  puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
                  *puVar1 = *puVar1 | 0x80;
                  in_R9->bos_id_ = v;
                  goto LAB_0023eb1b;
                }
                __y_33._M_str = "eos_id";
                __y_33._M_len = 6;
                pcVar7 = "eos_id";
                bVar3 = std::operator==(__x_30,__y_33);
                if (bVar3) {
                  arg_23._M_str = (char *)&v;
                  arg_23._M_len = (size_t)value_local._M_str;
                  bVar3 = string_util::lexical_cast<int>
                                    ((string_util *)value_local._M_len,arg_23,(int *)pcVar7);
                  if (!bVar3) {
                    local_1c0._0_4_ = kInvalidArgument;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
                    std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                    pSVar6 = util::StatusBuilder::operator<<
                                       ((StatusBuilder *)local_1c0,&value_local);
                    std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
                    util::StatusBuilder::operator_cast_to_Status
                              ((StatusBuilder *)
                               this._M_t.
                               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                               _M_head_impl);
                    goto LAB_0023dbe3;
                  }
                  puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
                  *puVar1 = *puVar1 | 0x100;
                  in_R9->eos_id_ = v;
                  goto LAB_0023eb1b;
                }
                __y_34._M_str = "pad_id";
                __y_34._M_len = 6;
                pcVar7 = "pad_id";
                bVar3 = std::operator==(__x_31,__y_34);
                if (bVar3) {
                  arg_24._M_str = (char *)&v;
                  arg_24._M_len = (size_t)value_local._M_str;
                  bVar3 = string_util::lexical_cast<int>
                                    ((string_util *)value_local._M_len,arg_24,(int *)pcVar7);
                  if (!bVar3) {
                    local_1c0._0_4_ = kInvalidArgument;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
                    std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                    pSVar6 = util::StatusBuilder::operator<<
                                       ((StatusBuilder *)local_1c0,&value_local);
                    std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
                    util::StatusBuilder::operator_cast_to_Status
                              ((StatusBuilder *)
                               this._M_t.
                               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                               _M_head_impl);
                    goto LAB_0023dbe3;
                  }
                  puVar1 = (in_R9->_has_bits_).has_bits_ + 1;
                  *puVar1 = *puVar1 | 0x200;
                  in_R9->pad_id_ = v;
                  goto LAB_0023eb1b;
                }
                __y_35._M_str = "unk_piece";
                __y_35._M_len = 9;
                bVar3 = std::operator==(__x_32,__y_35);
                if (bVar3) {
                  std::__cxx11::string::
                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                            ((string *)local_1c0,&value_local,(allocator<char> *)&v);
                  TrainerSpec::set_unk_piece(in_R9,(string *)local_1c0);
                }
                else {
                  __y_36._M_str = "bos_piece";
                  __y_36._M_len = 9;
                  bVar3 = std::operator==(__x_33,__y_36);
                  if (bVar3) {
                    std::__cxx11::string::
                    string<std::basic_string_view<char,std::char_traits<char>>,void>
                              ((string *)local_1c0,&value_local,(allocator<char> *)&v);
                    TrainerSpec::set_bos_piece(in_R9,(string *)local_1c0);
                  }
                  else {
                    __y_37._M_str = "eos_piece";
                    __y_37._M_len = 9;
                    bVar3 = std::operator==(__x_34,__y_37);
                    if (bVar3) {
                      std::__cxx11::string::
                      string<std::basic_string_view<char,std::char_traits<char>>,void>
                                ((string *)local_1c0,&value_local,(allocator<char> *)&v);
                      TrainerSpec::set_eos_piece(in_R9,(string *)local_1c0);
                    }
                    else {
                      __y_38._M_str = "pad_piece";
                      __y_38._M_len = 9;
                      bVar3 = std::operator==(__x_35,__y_38);
                      if (bVar3) {
                        std::__cxx11::string::
                        string<std::basic_string_view<char,std::char_traits<char>>,void>
                                  ((string *)local_1c0,&value_local,(allocator<char> *)&v);
                        TrainerSpec::set_pad_piece(in_R9,(string *)local_1c0);
                      }
                      else {
                        __y_39._M_str = "unk_surface";
                        __y_39._M_len = 0xb;
                        bVar3 = std::operator==(__x_36,__y_39);
                        if (!bVar3) {
                          __y_40._M_str = "enable_differential_privacy";
                          __y_40._M_len = 0x1b;
                          pcVar7 = "enable_differential_privacy";
                          bVar3 = std::operator==(__x_37,__y_40);
                          if (bVar3) {
                            pcVar8 = "true";
                            if (value_local._M_len != 0) {
                              pcVar8 = value_local._M_str;
                            }
                            psVar9 = (string_util *)0x4;
                            if (value_local._M_len != 0) {
                              psVar9 = (string_util *)value_local._M_len;
                            }
                            arg_25._M_str = (char *)&v;
                            arg_25._M_len = (size_t)pcVar8;
                            bVar3 = string_util::lexical_cast<bool>(psVar9,arg_25,(bool *)pcVar7);
                            if (bVar3) {
                              (in_R9->_has_bits_).has_bits_[0] =
                                   (in_R9->_has_bits_).has_bits_[0] | 0x4000;
                              in_R9->enable_differential_privacy_ = v._0_1_;
                              goto LAB_0023eb1b;
                            }
                            local_1c0._0_4_ = kInvalidArgument;
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
                            std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                            pSVar6 = util::StatusBuilder::operator<<
                                               ((StatusBuilder *)local_1c0,&value_local);
                            std::operator<<((ostream *)&pSVar6->os_,"\" as bool.");
                            util::StatusBuilder::operator_cast_to_Status
                                      ((StatusBuilder *)
                                       this._M_t.
                                       super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                       .
                                       super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>
                                       ._M_head_impl);
                          }
                          else {
                            __y_41._M_str = "differential_privacy_noise_level";
                            __y_41._M_len = 0x20;
                            pcVar7 = "differential_privacy_noise_level";
                            bVar3 = std::operator==(__x_38,__y_41);
                            if (bVar3) {
                              arg_26._M_str = (char *)&v;
                              arg_26._M_len = (size_t)value_local._M_str;
                              bVar3 = string_util::lexical_cast<double>
                                                ((string_util *)value_local._M_len,arg_26,
                                                 (double *)pcVar7);
                              if (bVar3) {
                                (in_R9->_has_bits_).has_bits_[0] =
                                     (in_R9->_has_bits_).has_bits_[0] | 0x400000;
                                in_R9->differential_privacy_noise_level_ =
                                     (float)(double)CONCAT44(uStack_1dc,v);
                                goto LAB_0023eb1b;
                              }
                              local_1c0._0_4_ = kInvalidArgument;
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)&local_1b8);
                              std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                              pSVar6 = util::StatusBuilder::operator<<
                                                 ((StatusBuilder *)local_1c0,&value_local);
                              std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
                              util::StatusBuilder::operator_cast_to_Status
                                        ((StatusBuilder *)
                                         this._M_t.
                                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                         .
                                         super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>
                                         ._M_head_impl);
                            }
                            else {
                              __y_42._M_str = "differential_privacy_clipping_threshold";
                              __y_42._M_len = 0x27;
                              pcVar7 = "differential_privacy_clipping_threshold";
                              bVar3 = std::operator==(__x_39,__y_42);
                              if (bVar3) {
                                arg_27._M_str = (char *)&v;
                                arg_27._M_len = (size_t)value_local._M_str;
                                bVar3 = string_util::lexical_cast<unsigned_long>
                                                  ((string_util *)value_local._M_len,arg_27,
                                                   (unsigned_long *)pcVar7);
                                if (bVar3) {
                                  (in_R9->_has_bits_).has_bits_[0] =
                                       (in_R9->_has_bits_).has_bits_[0] | 0x800000;
                                  in_R9->differential_privacy_clipping_threshold_ =
                                       CONCAT44(uStack_1dc,v);
                                  goto LAB_0023eb1b;
                                }
                                local_1c0._0_4_ = kInvalidArgument;
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)&local_1b8);
                                std::operator<<((ostream *)&local_1b8,"cannot parse \"");
                                pSVar6 = util::StatusBuilder::operator<<
                                                   ((StatusBuilder *)local_1c0,&value_local);
                                std::operator<<((ostream *)&pSVar6->os_,"\" as int.");
                                util::StatusBuilder::operator_cast_to_Status
                                          ((StatusBuilder *)
                                           this._M_t.
                                           super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                           .
                                           super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>
                                           ._M_head_impl);
                              }
                              else {
                                local_1c0._0_4_ = kNotFound;
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)&local_1b8);
                                std::operator<<((ostream *)&local_1b8,"unknown field name \"");
                                pSVar6 = util::StatusBuilder::operator<<
                                                   ((StatusBuilder *)local_1c0,&name_local);
                                std::operator<<((ostream *)&pSVar6->os_,"\" in TrainerSpec.");
                                util::StatusBuilder::operator_cast_to_Status
                                          ((StatusBuilder *)
                                           this._M_t.
                                           super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                           .
                                           super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>
                                           ._M_head_impl);
                              }
                            }
                          }
                          goto LAB_0023dbe3;
                        }
                        std::__cxx11::string::
                        string<std::basic_string_view<char,std::char_traits<char>>,void>
                                  ((string *)local_1c0,&value_local,(allocator<char> *)&v);
                        TrainerSpec::set_unk_surface(in_R9,(string *)local_1c0);
                      }
                    }
                  }
                }
              }
            }
            goto LAB_0023dc66;
          }
          util::StrSplitAsCSV_abi_cxx11_(in_stack_fffffffffffffe58);
          for (psVar11 = (string *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_); psVar11 != local_1b8;
              psVar11 = psVar11 + 1) {
            TrainerSpec::add_user_defined_symbols(in_R9,psVar11);
          }
        }
LAB_0023eb11:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1c0);
        goto LAB_0023eb1b;
      }
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_1c0,&value_local,(allocator<char> *)&v);
      TrainerSpec::set_pretokenization_delimiter(in_R9,(string *)local_1c0);
    }
  }
LAB_0023dc66:
  std::__cxx11::string::~string((string *)local_1c0);
LAB_0023eb1b:
  util::Status::Status
            ((Status *)
             this._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceTrainer::SetProtoField(absl::string_view name,
                                                 absl::string_view value,
                                                 TrainerSpec *message) {
  CHECK_OR_RETURN(message);

  PARSE_REPEATED_STRING(input);
  PARSE_STRING(input_format);
  PARSE_STRING(model_prefix);

  static const std::map<std::string, TrainerSpec::ModelType> kModelType_Map = {
      {"UNIGRAM", TrainerSpec::UNIGRAM},
      {"BPE", TrainerSpec::BPE},
      {"WORD", TrainerSpec::WORD},
      {"CHAR", TrainerSpec::CHAR},
  };

  PARSE_ENUM(model_type, kModelType_Map);
  PARSE_INT32(vocab_size);
  PARSE_REPEATED_STRING(accept_language);
  PARSE_INT32(self_test_sample_size);
  PARSE_DOUBLE(character_coverage);
  PARSE_UINT64(input_sentence_size);
  PARSE_BOOL(shuffle_input_sentence);
  PARSE_INT32(seed_sentencepiece_size);
  PARSE_DOUBLE(shrinking_factor);
  PARSE_INT32(max_sentence_length);
  PARSE_INT32(num_threads);
  PARSE_INT32(num_sub_iterations);
  PARSE_INT32(max_sentencepiece_length);
  PARSE_BOOL(split_by_unicode_script);
  PARSE_BOOL(split_by_number);
  PARSE_BOOL(split_by_whitespace);
  PARSE_BOOL(split_digits);
  PARSE_STRING(pretokenization_delimiter);
  PARSE_BOOL(treat_whitespace_as_suffix);
  PARSE_BOOL(allow_whitespace_only_pieces);
  PARSE_REPEATED_STRING(control_symbols);
  PARSE_REPEATED_STRING(user_defined_symbols);
  PARSE_STRING(required_chars);
  PARSE_BOOL(byte_fallback);
  PARSE_BOOL(hard_vocab_limit);
  PARSE_BOOL(vocabulary_output_piece_score);
  PARSE_BOOL(train_extremely_large_corpus);
  PARSE_STRING(seed_sentencepieces_file);
  PARSE_BOOL(use_all_vocab);
  PARSE_INT32(unk_id);
  PARSE_INT32(bos_id);
  PARSE_INT32(eos_id);
  PARSE_INT32(pad_id);
  PARSE_STRING(unk_piece);
  PARSE_STRING(bos_piece);
  PARSE_STRING(eos_piece);
  PARSE_STRING(pad_piece);
  PARSE_STRING(unk_surface);
  PARSE_BOOL(enable_differential_privacy);
  PARSE_DOUBLE(differential_privacy_noise_level);
  PARSE_UINT64(differential_privacy_clipping_threshold);

  return util::StatusBuilder(util::StatusCode::kNotFound, GTL_LOC)
         << "unknown field name \"" << name << "\" in TrainerSpec.";
}